

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall
CVmImageLoader::run(CVmImageLoader *this,char **argv,int argc,CVmRuntimeSymbols *global_symtab,
                   CVmRuntimeSymbols *macro_symtab,char *saved_state)

{
  vm_val_t *pvVar1;
  char *__s;
  CVmObjPageEntry *pCVar2;
  vm_datatype_t *pvVar3;
  ulong uVar4;
  vm_val_t *pvVar5;
  CVmImageLoader *this_00;
  err_frame_t *peVar6;
  CVmException *pCVar7;
  int iVar8;
  pool_ofs_t pVar9;
  vm_obj_id_t vVar10;
  undefined4 extraout_var;
  undefined8 *puVar11;
  long *plVar12;
  size_t sVar13;
  undefined4 extraout_var_00;
  size_t sVar14;
  char *buf;
  CCharmap *pCVar15;
  char **ppcVar16;
  bool bVar17;
  char *argstr;
  CVmImageLoader *local_198;
  CCharmap *local_190;
  uint local_188;
  pool_ofs_t local_184;
  CCharmap *local_180;
  char **local_178;
  size_t local_170;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  vm_rcdesc rc;
  err_frame_t err_cur__;
  
  argstr = (char *)0x0;
  iVar8 = (*(this->pools_[0]->super_CVmPoolBackingStore)._vptr_CVmPoolBackingStore[2])();
  if (CONCAT44(extraout_var,iVar8) == 0) {
    err_throw(0x140);
  }
  local_178 = argv;
  if (saved_state == (char *)0x0) {
    pVar9 = this->entrypt_;
  }
  else {
    pVar9 = G_predef_X.main_restore_func;
    if (G_predef_X.main_restore_func == 0) {
      err_throw(0x14d);
    }
  }
  local_168 = *(undefined4 *)&this->runtime_symtab_;
  uStack_164 = *(undefined4 *)((long)&this->runtime_symtab_ + 4);
  uStack_160 = *(undefined4 *)&this->runtime_macros_;
  uStack_15c = *(undefined4 *)((long)&this->runtime_macros_ + 4);
  G_image_loader_X = this;
  local_198 = this;
  puVar11 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar11;
  plVar12 = (long *)_ZTW11G_err_frame();
  *plVar12 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    bVar17 = G_file_path_X != (char *)0x0;
    if (!bVar17) {
      G_file_path_X = lib_copy_str(local_198->path_);
    }
    this_00 = local_198;
    if (global_symtab != (CVmRuntimeSymbols *)0x0) {
      local_198->runtime_symtab_ = global_symtab;
    }
    if (macro_symtab != (CVmRuntimeSymbols *)0x0) {
      local_198->runtime_macros_ = macro_symtab;
    }
    create_global_symtab_lookup_table(local_198);
    pvVar5 = sp_;
    vVar10 = this_00->reflection_symtab_;
    if (vVar10 != 0) {
      pvVar3 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar3 = VM_OBJ;
      (pvVar5->val).obj = vVar10;
    }
    create_macro_symtab_lookup_table(this_00);
    pvVar5 = sp_;
    vVar10 = this_00->reflection_macros_;
    if (vVar10 != 0) {
      pvVar3 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar3 = VM_OBJ;
      (pvVar5->val).obj = vVar10;
    }
    run_static_init(this_00);
    pvVar5 = sp_;
    if (saved_state == (char *)0x0) {
      local_188 = 1;
    }
    else {
      sp_ = sp_ + 1;
      sVar13 = strlen(saved_state);
      vVar10 = CVmObjString::create(0,saved_state,sVar13);
      pvVar5->typ = VM_OBJ;
      (pvVar5->val).obj = vVar10;
      local_188 = 2;
    }
    pCVar15 = (CCharmap *)0x0;
    local_190 = pCVar15;
    if (0 < argc) {
      if (G_net_config_X == (TadsNetConfig *)0x0) {
        os_get_charmap((char *)&rc,4);
      }
      else {
        uVar4 = (ulong)rc.argp >> 0x20;
        rc.argp = (vm_val_t *)CONCAT44((uint)uVar4 & 0xffffff00,0x38667475);
      }
      iVar8 = (*G_host_ifc_X->_vptr_CVmHostIfc[7])();
      local_190 = &CCharmapToUni::load((CResLoader *)CONCAT44(extraout_var_00,iVar8),(char *)&rc)->
                   super_CCharmap;
    }
    ppcVar16 = local_178;
    local_184 = pVar9;
    local_180 = pCVar15;
    if (0 < argc) {
      local_180 = (CCharmap *)(ulong)(uint)argc;
    }
    for (; local_180 != pCVar15;
        pCVar15 = (CCharmap *)((long)&((CCharmap *)&pCVar15->_vptr_CCharmap)->_vptr_CCharmap + 1)) {
      __s = ppcVar16[(long)pCVar15];
      if (local_190 == (CCharmap *)0x0) {
        sVar13 = strlen(__s);
        local_170 = sVar13;
        buf = (char *)malloc(sVar13 + 1);
        argstr = buf;
        memcpy(buf,__s,sVar13 + 1);
        ppcVar16 = local_178;
        CCharmapToUni::validate(buf,sVar13);
        sVar14 = local_170;
      }
      else {
        sVar14 = CCharmapToUni::map_str_alo((CCharmapToUni *)local_190,&argstr,__s);
      }
      CVmRun::push_string(&G_interpreter_X,argstr,sVar14);
      free(argstr);
      argstr = (char *)0x0;
    }
    sVar14 = (size_t)argc;
    vVar10 = CVmObjList::create(0,sVar14);
    pCVar2 = G_obj_table_X.pages_[vVar10 >> 0xc];
    for (pCVar15 = (CCharmap *)0x0; pvVar5 = sp_, argc = argc + -1, local_180 != pCVar15;
        pCVar15 = (CCharmap *)((long)&((CCharmap *)&pCVar15->_vptr_CCharmap)->_vptr_CCharmap + 1)) {
      CVmObjList::cons_set_element
                ((CVmObjList *)(pCVar2 + (vVar10 & 0xfff)),(size_t)pCVar15,sp_ + (-1 - (long)argc));
    }
    pvVar1 = sp_ + -sVar14;
    sp_ = sp_ + (1 - sVar14);
    pvVar1->typ = VM_OBJ;
    pvVar5[-sVar14].val.obj = vVar10;
    pvVar5 = sp_;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_PROP;
    (pvVar5->val).prop = 0;
    rc.bifptr.typ = VM_NIL;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_NIL;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_NIL;
    pvVar5 = sp_;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_NIL;
    (pvVar5->val).obj = 0;
    pvVar5 = sp_;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_FUNCPTR;
    (pvVar5->val).obj = local_184;
    rc.name = "Main entrypoint";
    rc.method_idx = 0;
    rc.argc = 0;
    rc.argp = (vm_val_t *)0x0;
    rc.caller_addr = (uchar *)0x0;
    rc.self.typ = rc.bifptr.typ;
    CVmRun::do_call(&G_interpreter_X,0,
                    (uchar *)(G_code_pool_X.super_CVmPoolPaged.pages_
                              [local_184 >>
                               ((byte)G_code_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem
                             + (G_code_pool_X.super_CVmPoolPaged._8_4_ - 1 & local_184)),local_188,
                    &rc);
    if (local_198->reflection_macros_ != 0) {
      sp_ = sp_ + -1;
    }
    pCVar15 = local_190;
    if (local_198->reflection_symtab_ != 0) {
      sp_ = sp_ + -1;
    }
  }
  else {
    bVar17 = true;
    pCVar15 = (CCharmap *)0x0;
  }
  if (-1 < (short)err_cur__.state_) {
    G_image_loader_X = (CVmImageLoader *)0x0;
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    local_198->runtime_symtab_ = (CVmRuntimeSymbols *)CONCAT44(uStack_164,local_168);
    local_198->runtime_macros_ = (CVmRuntimeSymbols *)CONCAT44(uStack_15c,uStack_160);
    if (pCVar15 != (CCharmap *)0x0) {
      CCharmap::release_ref(pCVar15);
    }
    free(argstr);
    if (!bVar17) {
      lib_free_str(G_file_path_X);
      G_file_path_X = (char *)0x0;
    }
  }
  peVar6 = err_cur__.prv_;
  puVar11 = (undefined8 *)_ZTW11G_err_frame();
  *puVar11 = peVar6;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar11 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar11 & 2) != 0) {
      plVar12 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar12 + 0x10));
    }
    pCVar7 = err_cur__.exc_;
    plVar12 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar12 + 0x10) = pCVar7;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  return;
}

Assistant:

void CVmImageLoader::run(VMG_ const char *const *argv, int argc,
                         CVmRuntimeSymbols *global_symtab,
                         CVmRuntimeSymbols *macro_symtab,
                         const char *saved_state)
{
    CVmRuntimeSymbols *orig_runtime_symtab, *orig_runtime_macros;
    pool_ofs_t entry_code_ofs;
    int entry_code_argc;
    CCharmapToUni *argmap = 0;
    char *argstr = 0;
    
    /* make sure we found a code pool definition */
    if (pools_[0]->vmpbs_get_page_count() < 1)
        err_throw(VMERR_IMAGE_NO_CODE);

    /* 
     *   Find the entrypoint.  If we have a saved state, call the function
     *   given by the exported symbol "mainRestore".  Otherwise, call the
     *   exported main entrypoint function.  
     */
    if (saved_state != 0)
    {
        /* 
         *   We're restoring a saved state file immediately on startup - call
         *   the exported "mainRestore" function.  If there is no such
         *   export, we can't run the program with an initial saved state.  
         */
        if (G_predef->main_restore_func == 0)
            err_throw(VMERR_NO_MAINRESTORE);

        /* use the mainRestore export */
        entry_code_ofs = G_predef->main_restore_func;
    }
    else
    {
        /* ordinary startup - use the exported primary entrypoint */
        entry_code_ofs = entrypt_;
    }

    /* we have no arguments to the entrypoint function yet */
    entry_code_argc = 0;

    /* set myself as the global image loader */
    G_image_loader = this;

    /* remember the original runtime symbol table */
    orig_runtime_symtab = runtime_symtab_;
    orig_runtime_macros = runtime_macros_;

    /* we haven't set the file path */
    int file_path_set = FALSE;

    /* catch any errors so we restore globals on the way out */
    err_try
    {
        int i;
        
        /* if there's no file path, use the image file folder by default */
        if (G_file_path == 0)
        {
            G_file_path = lib_copy_str(get_path());
            file_path_set = TRUE;
        }

        /* 
         *   if the caller gave us a runtime symbol table, use it over any
         *   we have already stored 
         */
        if (global_symtab != 0)
            runtime_symtab_ = global_symtab;
        if (macro_symtab != 0)
            runtime_macros_ = macro_symtab;

        /* create a LookupTable for the reflection symbols, if any */
        create_global_symtab_lookup_table(vmg0_);

        /* 
         *   if we successfully created a reflection symbol table, push it
         *   onto the stack - this will ensure that the object won't be
         *   discarded as long as the program is running 
         */
        if (reflection_symtab_ != VM_INVALID_OBJ)
        {
            /* set up an object value for the table and push it */
            G_stk->push()->set_obj(reflection_symtab_);
        }

        /* create and stack the reflection LookupTable for macros */
        create_macro_symtab_lookup_table(vmg0_);
        if (reflection_macros_ != VM_INVALID_OBJ)
            G_stk->push()->set_obj(reflection_macros_);

        /* 
         *   run static initializers (do this after creating the symbol
         *   table, in case any of the initializers want to access the
         *   symbol table) 
         */
        run_static_init(vmg0_);

        /* if there's a saved state file to restore, push it */
        if (saved_state != 0)
        {
            /* create a string object for the filename, and push it */
            G_stk->push()->set_obj(
                CVmObjString::create(vmg_ FALSE,
                                     saved_state, strlen(saved_state)));

            /* count the extra startup argument */
            ++entry_code_argc;
        }

        /* get a character mapper for the command-line arguments */
        if (argc > 0)
        {
            /* 
             *   If we have a net configuration, assume that the arguments
             *   are in UTF-8 format, since they're coming from a web server.
             *   Otherwise, ask the OS which character set to use for
             *   command-line parameters.
             */
            char argcs[40];
            if (G_net_config != 0)
                strcpy(argcs, "utf8");
            else
                os_get_charmap(argcs, OS_CHARMAP_CMDLINE);

            /* load the character set */
            argmap = CCharmapToUni::load(
                G_host_ifc->get_sys_res_loader(), argcs);
        }

        /* 
         *   push a string object for each argument - push them onto the
         *   stack to ensure that they're referenced in case garbage
         *   collection occurs while we're working 
         */
        for (i = 0 ; i < argc ; ++i)
        {
            /* if we have a character mapper, map the argument string */
            size_t slen;
            if (argmap != 0)
            {
                /* map the argument to UTF8 */
                slen = argmap->map_str_alo(&argstr, argv[i]);
            }
            else
            {
                /* make a copy of the string */
                slen = strlen(argv[i]);
                argstr = (char *)t3malloc(slen + 1);
                memcpy(argstr, argv[i], slen + 1);

                /* make sure it's well-formed UTF-8 */
                CCharmapToUni::validate(argstr, slen);
            }

            /* push the mapped/adjusted string argument */
            G_interpreter->push_string(vmg_ argstr, slen);

            /* done with the mapped/adjusted string */
            t3free(argstr);
            argstr = 0;
        }

        /* create a list to hold the strings */
        vm_obj_id_t lst_obj = CVmObjList::create(vmg_ FALSE, argc);
        CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

        /* set the list elements to the strings */
        for (i = 0 ; i < argc ; ++i)
        {
            vm_val_t *strp;
            
            /* 
             *   Get this item from the stack.  Note that the most recently
             *   pushed item is number 0, then number 1, and so on - the
             *   last argument string (at index argc) is thus number 0, and
             *   the first (at index 0) is number argc.  
             */
            strp = G_stk->get(argc - i - 1);

            /* set this list element */
            lst->cons_set_element(i, strp);
        }

        /* 
         *   we don't need the strings themselves any more, as we can reach
         *   them through the list, so drop the strings from the stack 
         */
        G_stk->discard(argc);
        
        /* push the list - it's the argument to the program entrypoint */
        G_stk->push()->set_obj(lst_obj);
        ++entry_code_argc;

        /* 
         *   Invoke the entrypoint function - it takes two arguments (the
         *   list of argument strings, and the name of the initial saved
         *   state file to restore, if any).  
         */
        G_stk->push()->set_propid(VM_INVALID_PROP);
        G_stk->push()->set_nil();
        G_stk->push()->set_nil();
        G_stk->push()->set_nil_obj();
        G_stk->push()->set_fnptr(entry_code_ofs);
        vm_rcdesc rc("Main entrypoint");
        G_interpreter->do_call(
            vmg_ 0,
            (const uchar *)G_code_pool->get_ptr(entry_code_ofs),
            entry_code_argc, &rc);

        /* 
         *   if we pushed a global symbol table LookupTable object, pop it -
         *   we left it on the stack to protect it from the garbage
         *   collector, since it's always implicitly referenced from the
         *   intrinsic function that retrieves the symbol table object 
         */
        if (reflection_macros_ != VM_INVALID_OBJ)
            G_stk->discard();
        if (reflection_symtab_ != VM_INVALID_OBJ)
            G_stk->discard();
    }